

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O1

int big_file_list(BigFile *bf,char ***blocknames,int *Nblocks)

{
  char *__src;
  bblist *__ptr;
  bblist *pbVar1;
  char **ppcVar2;
  char *__dest;
  uint uVar3;
  ulong uVar4;
  size_t __n;
  
  uVar3 = 0;
  __ptr = listbigfile_r(bf->basename,"",(bblist *)0x0);
  if (__ptr != (bblist *)0x0) {
    uVar3 = 0;
    pbVar1 = __ptr;
    do {
      uVar3 = uVar3 + 1;
      pbVar1 = pbVar1->next;
    } while (pbVar1 != (bblist *)0x0);
  }
  *Nblocks = uVar3;
  ppcVar2 = (char **)malloc((ulong)uVar3 * 8);
  *blocknames = ppcVar2;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      __src = __ptr->blockname;
      __n = 0;
      do {
        if (__src[__n] == '\0') goto LAB_00102b70;
        __n = __n + 1;
      } while (__n != 0x2000);
      __n = 0x2000;
LAB_00102b70:
      __dest = (char *)malloc(__n + 1);
      strncpy(__dest,__src,__n);
      __dest[__n] = '\0';
      (*blocknames)[uVar4] = __dest;
      pbVar1 = __ptr->next;
      free(__ptr);
      uVar4 = uVar4 + 1;
      __ptr = pbVar1;
    } while (uVar4 != uVar3);
  }
  return 0;
}

Assistant:

int
big_file_list(BigFile * bf, char *** blocknames, int * Nblocks)
{
    struct bblist * bblist = listbigfile_r(bf->basename, "", NULL);
    struct bblist * p;
    int N = 0;
    int i;
    for(p = bblist; p; p = p->next) {
        N ++;
    }
    *Nblocks = N;
    *blocknames = malloc(sizeof(char*) * N);
    for(i = 0; i < N; i ++) {
        (*blocknames)[i] = _strdup(bblist->blockname);
        p = bblist;
        bblist = bblist->next;
        free(p); 
    }
    return 0;
}